

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O0

void __thiscall tcmalloc::StackTraceTable::AddTrace(StackTraceTable *this,StackTrace *t)

{
  LogItem b;
  LogItem c;
  LogItem d;
  LogItem a;
  LogItem local_60;
  LogItem local_50;
  LogItem local_40;
  LogItem local_30;
  pointer local_20;
  Entry *entry;
  StackTrace *t_local;
  StackTraceTable *this_local;
  
  if ((this->error_ & 1U) == 0) {
    entry = (Entry *)t;
    t_local = (StackTrace *)this;
    local_20 = STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::allocate
                         ((STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void> *)
                          &this->field_0x10,1,(void *)0x0);
    if (local_20 == (pointer)0x0) {
      LogItem::LogItem(&local_30,"tcmalloc: could not allocate bucket");
      LogItem::LogItem(&local_40,0x110);
      LogItem::LogItem(&local_50);
      LogItem::LogItem(&local_60);
      a._4_4_ = 0;
      a.tag_ = local_30.tag_;
      b.u_.str = local_40.u_.str;
      b.tag_ = local_40.tag_;
      b._4_4_ = local_40._4_4_;
      c.u_.str = local_50.u_.str;
      c.tag_ = local_50.tag_;
      c._4_4_ = local_50._4_4_;
      d.u_.str = local_60.u_.str;
      d.tag_ = local_60.tag_;
      d._4_4_ = local_60._4_4_;
      a.u_.str = local_30.u_.str;
      Log(kLog,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/stack_trace_table.cc"
          ,0x57,a,b,c,d);
      this->error_ = true;
    }
    else {
      memcpy(&local_20->trace,entry,0x108);
      local_20->next = this->head_;
      this->head_ = local_20;
    }
  }
  return;
}

Assistant:

void StackTraceTable::AddTrace(const StackTrace& t) {
  if (error_) {
    return;
  }

  Entry* entry = allocator_.allocate(1);
  if (entry == nullptr) {
    Log(kLog, __FILE__, __LINE__,
        "tcmalloc: could not allocate bucket", sizeof(*entry));
    error_ = true;
  } else {
    entry->trace = t;
    entry->next = head_;
    head_ = entry;
  }
}